

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O2

void __thiscall SortableOIDType::~SortableOIDType(SortableOIDType *this)

{
  ~SortableOIDType(this);
  operator_delete(this);
  return;
}

Assistant:

explicit SortableOIDType(const std::string& value): OIDType(value), sortingMap(generateSortingMap()){}